

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int PatchMusic(int dummy)

{
  int iVar1;
  char *in_RAX;
  char *newString;
  FString *this;
  FString keystring;
  
  keystring.Chars = in_RAX;
  DPrintf(4,"[Music]\n");
  while( true ) {
    iVar1 = GetLine();
    if (iVar1 != 1) break;
    newString = skipwhite(Line2);
    keystring.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    this = FString::operator+=(&keystring,"MUSIC_");
    FString::operator+=(this,Line1);
    FStringTable::SetString(&GStrings,keystring.Chars,newString);
    DPrintf(4,"Music %s set to:\n%s\n",keystring.Chars,newString);
    FString::~FString(&keystring);
  }
  return iVar1;
}

Assistant:

static int PatchMusic (int dummy)
{
	int result;

	DPrintf (DMSG_SPAMMY, "[Music]\n");

	while ((result = GetLine()) == 1)
	{
		const char *newname = skipwhite (Line2);
		FString keystring;
		
		keystring << "MUSIC_" << Line1;

		GStrings.SetString (keystring, newname);
		DPrintf (DMSG_SPAMMY, "Music %s set to:\n%s\n", keystring.GetChars(), newname);
	}

	return result;
}